

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex.cpp
# Opt level: O1

void __thiscall
ary::AnchoredLocalization::draw(AnchoredLocalization *this,Mat *image,SharedCameraModel *model)

{
  element_type *peVar1;
  double dVar2;
  undefined8 m;
  SharedCameraModel *pSVar3;
  Size SVar4;
  int i;
  pointer pPVar5;
  long lVar6;
  Mat *pMVar7;
  _OutputArray *p_Var8;
  int i_1;
  long lVar9;
  ulong uVar10;
  double s;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  CameraPosition camera;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> model2ImagePts;
  Matx<double,_4,_1> c;
  Mat modelPts;
  Matx44f offset;
  _InputArray local_328;
  uchar *local_310;
  Size local_308;
  Mat *local_300;
  SharedCameraModel *local_2f8;
  long local_2f0;
  int local_2e8;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  int local_2d8;
  int local_2d4;
  MatConstIterator local_2d0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  float *local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  uchar *local_258;
  uchar *puStack_250;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  _InputArray local_1e0;
  _InputArray local_1c8;
  _InputArray local_1b0;
  float local_198;
  float fStack_194;
  undefined8 uStack_190;
  _OutputArray local_188;
  _InputArray local_170;
  undefined1 local_158 [16];
  uchar *local_148;
  uchar *puStack_140;
  uchar *local_138;
  uchar *puStack_130;
  MatAllocator *local_128;
  UMatData *pUStack_120;
  MatSize local_118;
  size_t *psStack_110;
  size_t local_108;
  size_t sStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  uchar *local_c8;
  uchar *puStack_c0;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pPVar5 = (this->localizations).
           super__Vector_base<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->localizations).
      super__Vector_base<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pPVar5) {
    uVar10 = 0;
    local_300 = image;
    local_2f8 = model;
    do {
      peVar1 = pPVar5[uVar10].super_shared_ptr<ary::Localization>.
               super___shared_ptr<ary::Localization,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*peVar1->_vptr_Localization[3])(peVar1,image);
      local_298 = (float *)0x0;
      uStack_290 = 0;
      local_288 = 0;
      lVar6 = (long)(this->anchors).
                    super__Vector_base<cv::Ptr<ary::SceneAnchor>,_std::allocator<cv::Ptr<ary::SceneAnchor>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar10].
                    super_shared_ptr<ary::SceneAnchor>.
                    super___shared_ptr<ary::SceneAnchor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_48 = *(undefined8 *)(lVar6 + 0x58);
      uStack_40 = *(undefined8 *)(lVar6 + 0x60);
      local_58 = *(undefined8 *)(lVar6 + 0x48);
      uStack_50 = *(undefined8 *)(lVar6 + 0x50);
      local_68 = *(undefined8 *)(lVar6 + 0x38);
      uStack_60 = *(undefined8 *)(lVar6 + 0x40);
      local_78 = *(undefined8 *)(lVar6 + 0x28);
      uStack_70 = *(undefined8 *)(lVar6 + 0x30);
      local_c8 = (uchar *)0x0;
      local_d8._0_4_ = 0;
      local_d8._4_4_ = 0;
      uStack_d0._0_4_ = 0;
      uStack_d0._4_4_ = 0;
      puStack_c0 = (uchar *)0x3ff0000000000000;
      local_e8 = 0;
      uStack_e0 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      local_108 = 0;
      sStack_100 = 0;
      local_118.p = (int *)0x0;
      psStack_110 = (size_t *)0x0;
      local_128 = (MatAllocator *)0x0;
      pUStack_120 = (UMatData *)0x0;
      local_138 = (uchar *)0x0;
      puStack_130 = (uchar *)0x0;
      local_148 = (uchar *)0x0;
      puStack_140 = (uchar *)0x0;
      local_158._0_4_ = 0;
      local_158._4_4_ = 0;
      local_158._8_4_ = 0;
      local_158._12_4_ = 0;
      lVar6 = 0;
      do {
        *(double *)(local_158 + (lVar6 * 2 + -2) * 4 + 8) =
             (double)*(float *)((long)&local_78 + lVar6 * 4);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x10);
      lVar6 = 0;
      pMVar7 = (Mat *)local_158;
      do {
        dVar2 = 0.0;
        lVar9 = 0;
        do {
          dVar2 = dVar2 + *(double *)(&((Mat *)(&pMVar7->step + -3))->rows + lVar9 * 2 + -2) *
                          *(double *)(local_d8 + lVar9 * 8);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
        *(double *)(local_268 + (lVar6 * 2 + -2) * 4 + 8) = dVar2;
        lVar6 = lVar6 + 1;
        pMVar7 = (Mat *)&pMVar7->dataend;
      } while (lVar6 != 4);
      local_158._0_8_ = local_268._0_8_;
      local_158._8_8_ = local_268._8_8_;
      local_148 = local_258;
      puStack_140 = puStack_250;
      local_268._0_8_ = 0;
      local_268._8_4_ = 0;
      local_268._12_4_ = 0;
      lVar6 = 0;
      do {
        *(float *)(local_268 + (lVar6 + -2) * 4 + 8) =
             (float)*(double *)(local_158 + (lVar6 * 2 + -2) * 4 + 8);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      local_2a8 = local_268._0_8_;
      uStack_2a0 = 0;
      local_198 = (float)local_268._8_4_;
      fStack_194 = (float)local_268._12_4_;
      uStack_190 = 0;
      local_2f0 = uVar10 * 0x10;
      cv::Mat::Mat((Mat *)local_d8,3,3,5);
      cv::MatConstIterator::MatConstIterator(&local_2d0,(Mat *)local_d8);
      *(float *)local_2d0.ptr = 0.01;
      SVar4 = (Size)local_2d0.ptr;
      if ((local_2d0.m != (Mat *)0x0) &&
         (SVar4 = (Size)(local_2d0.elemSize + (long)local_2d0.ptr),
         local_2d0.sliceEnd <= local_2d0.elemSize + (long)local_2d0.ptr)) {
        cv::MatConstIterator::seek((long)&local_2d0,true);
        SVar4 = (Size)local_2d0.ptr;
      }
      local_2d0.ptr = (uchar *)SVar4;
      local_328._0_8_ = local_2d0.m;
      local_328.obj = (void *)local_2d0.elemSize;
      local_328.sz = (Size)local_2d0.ptr;
      local_310 = local_2d0.sliceStart;
      local_308 = (Size)local_2d0.sliceEnd;
      *(float *)local_2d0.ptr = 0.01;
      if ((local_2d0.m != (Mat *)0x0) &&
         (local_328.sz = (Size)(local_2d0.elemSize + (long)local_2d0.ptr),
         local_2d0.sliceEnd <= (ulong)local_328.sz)) {
        local_328.sz = (Size)local_2d0.ptr;
        cv::MatConstIterator::seek((long)&local_328,true);
      }
      *(float *)local_328.sz = 0.01;
      SVar4 = local_328.sz;
      if (((Mat *)local_328._0_8_ != (Mat *)0x0) &&
         (SVar4 = (Size)((long)local_328.obj + (long)local_328.sz),
         (ulong)local_308 <= (ulong)((long)local_328.obj + (long)local_328.sz))) {
        cv::MatConstIterator::seek((long)&local_328,true);
        SVar4 = local_328.sz;
      }
      local_328.sz = SVar4;
      *(float *)local_328.sz = 0.0;
      SVar4 = local_328.sz;
      if (((Mat *)local_328._0_8_ != (Mat *)0x0) &&
         (SVar4 = (Size)((long)local_328.obj + (long)local_328.sz),
         (ulong)local_308 <= (ulong)((long)local_328.obj + (long)local_328.sz))) {
        cv::MatConstIterator::seek((long)&local_328,true);
        SVar4 = local_328.sz;
      }
      local_328.sz = SVar4;
      *(float *)local_328.sz = 0.0;
      SVar4 = local_328.sz;
      if (((Mat *)local_328._0_8_ != (Mat *)0x0) &&
         (SVar4 = (Size)((long)local_328.obj + (long)local_328.sz),
         (ulong)local_308 <= (ulong)((long)local_328.obj + (long)local_328.sz))) {
        cv::MatConstIterator::seek((long)&local_328,true);
        SVar4 = local_328.sz;
      }
      local_328.sz = SVar4;
      *(float *)local_328.sz = 0.0;
      SVar4 = local_328.sz;
      if (((Mat *)local_328._0_8_ != (Mat *)0x0) &&
         (SVar4 = (Size)((long)local_328.obj + (long)local_328.sz),
         (ulong)local_308 <= (ulong)((long)local_328.obj + (long)local_328.sz))) {
        cv::MatConstIterator::seek((long)&local_328,true);
        SVar4 = local_328.sz;
      }
      local_328.sz = SVar4;
      *(float *)local_328.sz = (float)local_2a8 / fStack_194;
      fVar11 = fStack_194;
      fVar12 = fStack_194;
      fVar13 = fStack_194;
      fVar14 = fStack_194;
      SVar4 = local_328.sz;
      if (((Mat *)local_328._0_8_ != (Mat *)0x0) &&
         (SVar4 = (Size)((long)local_328.obj + (long)local_328.sz),
         (ulong)local_308 <= (ulong)((long)local_328.obj + (long)local_328.sz))) {
        local_278 = fStack_194;
        fStack_274 = fStack_194;
        fStack_270 = fStack_194;
        fStack_26c = fStack_194;
        cv::MatConstIterator::seek((long)&local_328,true);
        fVar11 = local_278;
        fVar12 = fStack_274;
        fVar13 = fStack_270;
        fVar14 = fStack_26c;
        SVar4 = local_328.sz;
      }
      local_328.sz = SVar4;
      *(float *)local_328.sz = local_2a8._4_4_ / fVar11;
      SVar4 = local_328.sz;
      if (((Mat *)local_328._0_8_ != (Mat *)0x0) &&
         (SVar4 = (Size)((long)local_328.obj + (long)local_328.sz),
         (ulong)local_308 <= (ulong)((long)local_328.obj + (long)local_328.sz))) {
        local_278 = fVar11;
        fStack_274 = fVar12;
        fStack_270 = fVar13;
        fStack_26c = fVar14;
        cv::MatConstIterator::seek((long)&local_328,true);
        fVar11 = local_278;
        SVar4 = local_328.sz;
      }
      local_328.sz = SVar4;
      *(float *)local_328.sz = local_198 / fVar11;
      SVar4 = local_328.sz;
      if (((Mat *)local_328._0_8_ != (Mat *)0x0) &&
         (SVar4 = (Size)((long)local_328.obj + (long)local_328.sz),
         (ulong)local_308 <= (ulong)((long)local_328.obj + (long)local_328.sz))) {
        cv::MatConstIterator::seek((long)&local_328,true);
        SVar4 = local_328.sz;
      }
      local_328.sz = SVar4;
      m = local_328._0_8_;
      cv::Mat::Mat((Mat *)local_268);
      local_268._0_8_ = local_268._0_8_ & 0xfffffffffffff000 | 5;
      cv::Mat_<float>::operator=((Mat_<float> *)local_268,(Mat *)m);
      cv::Mat::Mat((Mat *)local_158,(Mat *)local_268);
      cv::Mat::~Mat((Mat *)local_268);
      cv::Mat::~Mat((Mat *)local_d8);
      (**(code **)(**(long **)((long)&(((this->localizations).
                                        super__Vector_base<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super_shared_ptr<ary::Localization>).
                                      super___shared_ptr<ary::Localization,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + local_2f0) + 0x10))(&local_2d0);
      pSVar3 = local_2f8;
      local_328.sz.width = 0;
      local_328.sz.height = 0;
      local_328.flags = 0x1010000;
      local_1b0.flags = -0x3efdfffb;
      local_1b0.sz.width = 1;
      local_1b0.sz.height = 3;
      local_1c8.flags = -0x3efdfffb;
      local_1c8.obj = (void *)((long)&local_2d0.elemSize + 4);
      local_1c8.sz.width = 1;
      local_1c8.sz.height = 3;
      local_328.obj = (Mat *)local_158;
      local_1b0.obj = &local_2d0;
      CameraModel::getIntrinsics
                ((local_2f8->super_shared_ptr<ary::CameraModel>).
                 super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      local_1e0.flags = -0x3efdfffb;
      local_1e0.sz.width = 3;
      local_1e0.sz.height = 3;
      local_2a8 = uVar10;
      local_1e0.obj = (Mat *)local_d8;
      CameraModel::getDistortion
                ((Mat *)local_268,
                 (pSVar3->super_shared_ptr<ary::CameraModel>).
                 super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      local_170.sz.width = 0;
      local_170.sz.height = 0;
      local_170.flags = 0x1010000;
      local_188.super__InputArray.sz.width = 0;
      local_188.super__InputArray.sz.height = 0;
      local_188.super__InputArray.flags = -0x7dfcfff3;
      local_188.super__InputArray.obj = &local_298;
      local_170.obj = (Mat *)local_268;
      p_Var8 = (_OutputArray *)cv::noArray();
      pMVar7 = local_300;
      cv::projectPoints(&local_328,&local_1b0,&local_1c8,&local_1e0,&local_170,&local_188,p_Var8,0.0
                       );
      cv::Mat::~Mat((Mat *)local_268);
      local_c8 = (uchar *)0x0;
      local_d8._0_4_ = 3.7909693e-37;
      uStack_d0 = pMVar7;
      local_2d8 = (int)ROUND(local_298[2]);
      local_2d4 = (int)ROUND(local_298[3]);
      local_2e0 = (int)ROUND(local_298[4]);
      local_2dc = (int)ROUND(local_298[5]);
      local_268._0_4_ = 0;
      local_268._4_4_ = 0x406fe000;
      local_268._8_4_ = 0;
      local_268._12_4_ = 0x406fe000;
      local_258 = (uchar *)0x0;
      puStack_250 = (uchar *)0x0;
      cv::line((Mat *)local_d8,&local_2d8,&local_2e0,(Mat *)local_268,2,8,
               (ulong)p_Var8 & 0xffffffff00000000);
      local_c8 = (uchar *)0x0;
      local_d8._0_4_ = 0x3010000;
      uStack_d0 = pMVar7;
      lVar6 = *(long *)((long)&(((this->anchors).
                                 super__Vector_base<cv::Ptr<ary::SceneAnchor>,_std::allocator<cv::Ptr<ary::SceneAnchor>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_shared_ptr<ary::SceneAnchor>).
                               super___shared_ptr<ary::SceneAnchor,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr + local_2f0);
      lVar9 = *(long *)(lVar6 + 8);
      local_268._0_8_ = local_268 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_268,lVar9,*(long *)(lVar6 + 0x10) + lVar9);
      local_2e8 = (int)ROUND(*local_298);
      local_2e4 = (int)ROUND(local_298[1]);
      local_208 = 0x406fe00000000000;
      uStack_200 = 0x4059000000000000;
      local_1f8 = 0x406fe00000000000;
      uStack_1f0 = 0;
      cv::putText(0,(Mat *)local_d8,(Mat *)local_268,&local_2e8,0,&local_208,2,8,0);
      uVar10 = local_2a8;
      if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
        operator_delete((void *)local_268._0_8_);
      }
      cv::Mat::~Mat((Mat *)local_158);
      image = local_300;
      if (local_298 != (float *)0x0) {
        operator_delete(local_298);
      }
      uVar10 = uVar10 + 1;
      pPVar5 = (this->localizations).
               super__Vector_base<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      model = local_2f8;
    } while (uVar10 < (ulong)((long)(this->localizations).
                                    super__Vector_base<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar5 >> 4))
    ;
  }
  (*(this->super_Localization)._vptr_Localization[2])((CameraPosition *)local_d8,this);
  CameraModel::getIntrinsics
            ((model->super_shared_ptr<ary::CameraModel>).
             super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  CameraModel::getDistortion
            ((Mat *)local_158,
             (model->super_shared_ptr<ary::CameraModel>).
             super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  drawSystem(image,(CameraPosition *)local_d8,(Matx33f *)local_268,(Mat *)local_158,0.1,3);
  cv::Mat::~Mat((Mat *)local_158);
  return;
}

Assistant:

void AnchoredLocalization::draw(Mat& image, SharedCameraModel& model) const {

    for (size_t i = 0; i < localizations.size(); i++) {
        localizations[i]->draw(image, model);

        std::vector<cv::Point2f> model2ImagePts;
        
        Matx44f offset = anchors[i]->getTransform();

        Point3f origin = extract_homogeneous(offset * Scalar(0, 0, 0, 1));

        Mat modelPts = (Mat_<float>(3, 3) <<
                        0.01, 0.01, 0.01,
                        0, 0, 0,
                        origin.x, origin.y, origin.z);

        CameraPosition camera = localizations[i]->getCameraPosition();

        projectPoints(modelPts, camera.rotation, camera.translation, model->getIntrinsics(), model->getDistortion(), model2ImagePts);

        line(image, model2ImagePts[1], model2ImagePts[2], Scalar(255, 255, 0), 2);

        putText(image, anchors[i]->getName(), model2ImagePts[0], FONT_HERSHEY_SIMPLEX, 0.5f, Scalar(255, 100, 255), 2);

    }

    drawSystem(image, getCameraPosition(), model->getIntrinsics(), model->getDistortion());

}